

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

void glcts::prepareGradXForFace
               (GLfloat *grad_x,GLuint face,GLfloat *texture_coordinates,GLuint width)

{
  GLuint i;
  ulong uVar1;
  GLfloat *pGVar2;
  long lVar3;
  GLfloat *pGVar4;
  
  pGVar4 = grad_x;
  pGVar2 = texture_coordinates;
  for (uVar1 = 0; uVar1 < 9; uVar1 = uVar1 + 2) {
    getRightNeighbour(pGVar2,face,1,width,pGVar4);
    pGVar2 = pGVar2 + 8;
    pGVar4 = pGVar4 + 8;
  }
  pGVar4 = texture_coordinates + 4;
  pGVar2 = grad_x + 4;
  for (uVar1 = 1; uVar1 < 9; uVar1 = uVar1 + 2) {
    getRightNeighbour(pGVar4,face,width * 4,width,pGVar2);
    pGVar4 = pGVar4 + 8;
    pGVar2 = pGVar2 + 8;
  }
  for (lVar3 = 0; lVar3 != 0x90; lVar3 = lVar3 + 0x10) {
    vectorSubtractInPlace<3u>
              ((GLfloat *)((long)grad_x + lVar3),(GLfloat *)((long)texture_coordinates + lVar3));
  }
  return;
}

Assistant:

void prepareGradXForFace(glw::GLfloat* grad_x, glw::GLuint face, glw::GLfloat* texture_coordinates, glw::GLuint width)
{
	static const glw::GLuint n_points_per_face				  = 9;
	static const glw::GLuint n_texture_coordinates_components = 4;
	static const glw::GLuint n_grad_components				  = 4;

	for (glw::GLuint i = 0; i < n_points_per_face; i += 2)
	{
		const glw::GLuint texture_coordinates_offset = i * n_texture_coordinates_components;
		const glw::GLuint grad_offset				 = i * n_grad_components;

		getRightNeighbour(texture_coordinates + texture_coordinates_offset, face, 1, width, grad_x + grad_offset);
	}

	for (glw::GLuint i = 1; i < n_points_per_face; i += 2)
	{
		const glw::GLuint texture_coordinates_offset = i * n_texture_coordinates_components;
		const glw::GLuint grad_offset				 = i * n_grad_components;

		getRightNeighbour(texture_coordinates + texture_coordinates_offset, face, 4 * width, width,
						  grad_x + grad_offset);
	}

	for (glw::GLuint i = 0; i < n_points_per_face; ++i)
	{
		const glw::GLuint texture_coordinates_offset = i * n_texture_coordinates_components;
		const glw::GLuint grad_offset				 = i * n_grad_components;

		vectorSubtractInPlace<3>(grad_x + grad_offset, texture_coordinates + texture_coordinates_offset);
	}
}